

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  __m128i *palVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  parasail_result_t *ppVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  longlong lVar15;
  ulong uVar16;
  ulong uVar17;
  longlong lVar18;
  longlong lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar50;
  short sVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int16_t *ptr_00;
  __m128i *palVar55;
  uint uVar56;
  int iVar57;
  int32_t t;
  int iVar58;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  int seglen;
  ushort uVar59;
  short sVar60;
  short sVar61;
  short sVar65;
  short sVar66;
  short sVar68;
  short sVar69;
  ushort uVar70;
  short sVar71;
  short sVar72;
  ulong uVar62;
  ushort uVar64;
  ushort uVar67;
  ushort uVar73;
  short sVar74;
  short sVar75;
  ushort uVar77;
  ushort uVar80;
  undefined1 auVar63 [16];
  short sVar78;
  short sVar79;
  short sVar81;
  short sVar82;
  ushort uVar83;
  short sVar84;
  short sVar85;
  ulong uVar76;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  __m128i alVar93;
  __m128i alVar94;
  __m128i alVar95;
  __m128i alVar96;
  __m128i alVar97;
  __m128i alVar98;
  __m128i alVar99;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  ulong local_10f8;
  long local_10e8;
  long local_10e0;
  ulong uStack_10c8;
  __m128i vHL_2;
  __m128i vHS_2;
  __m128i vHM_2;
  __m128i vH_2;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int16_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_e10;
  short local_e0e;
  short local_e0c;
  short local_e0a;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m128i vOne;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_d10;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_818;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_810;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  ushort local_808;
  ushort uStack_806;
  ushort uStack_804;
  ushort uStack_802;
  ushort uStack_800;
  ushort uStack_7fe;
  ushort uStack_7fc;
  ushort uStack_7fa;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7b0;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  ushort local_728;
  ushort uStack_726;
  ushort uStack_724;
  ushort uStack_722;
  ushort uStack_720;
  ushort uStack_71e;
  ushort uStack_71c;
  ushort uStack_71a;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  ushort local_6f8;
  ushort uStack_6f6;
  ushort uStack_6f4;
  ushort uStack_6f2;
  ushort uStack_6f0;
  ushort uStack_6ee;
  ushort uStack_6ec;
  ushort uStack_6ea;
  ushort local_6a8;
  ushort uStack_6a6;
  ushort uStack_6a4;
  ushort uStack_6a2;
  ushort uStack_6a0;
  ushort uStack_69e;
  ushort uStack_69c;
  ushort uStack_69a;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  ulong uStack_f0;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  size_t len;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16","s2")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_16",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar53 = profile->s1Len;
    local_d10 = iVar53 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar52 = (iVar53 + 7) / 8;
    iVar58 = (iVar53 + -1) % iVar52;
    iVar53 = ~((iVar53 + -1) / iVar52) + 8;
    pvVar3 = (profile->profile16).score;
    pvVar4 = (profile->profile16).matches;
    pvVar5 = (profile->profile16).similar;
    i._0_2_ = (short)open;
    uVar10 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar13 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (undefined2)gap;
    uVar11 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    uVar14 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    if (ppVar2->min <= -open) {
      i._0_2_ = -(short)ppVar2->min;
    }
    sVar50 = (short)i + -0x7fff;
    sVar51 = ((ushort)ppVar2->max ^ 0x7fff) - 1;
    ppVar12 = (parasail_result_t *)CONCAT26(sVar50,CONCAT24(sVar50,CONCAT22(sVar50,sVar50)));
    lVar15 = CONCAT26(sVar50,CONCAT24(sVar50,CONCAT22(sVar50,sVar50)));
    vSaturationCheckMax[1] = CONCAT26(sVar51,CONCAT24(sVar51,CONCAT22(sVar51,sVar51)));
    vSaturationCheckMin[0] = CONCAT26(sVar51,CONCAT24(sVar51,CONCAT22(sVar51,sVar51)));
    seglen = gap;
    result = ppVar12;
    vSaturationCheckMax[0] = lVar15;
    _segNum = (parasail_profile_t *)parasail_result_new_rowcol3(iVar52 * 8,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x8210801;
      uVar56 = *(uint *)&_segNum->field_0xc | 0x40000;
      len = (size_t)uVar56;
      *(uint *)&_segNum->field_0xc = uVar56;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar52);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar52);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar52);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar52);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar52);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar52);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar52);
      pvE = parasail_memalign___m128i(0x10,(long)iVar52);
      ptr = parasail_memalign___m128i(0x10,(long)iVar52);
      b = parasail_memalign___m128i(0x10,(long)iVar52);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar52);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar52);
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar93[0] = (long)iVar52;
        alVar93[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar93,len);
        alVar94[0] = (long)iVar52;
        alVar94[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar94,len);
        alVar95[0] = (long)iVar52;
        alVar95[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar95,len);
        alVar96[0] = (long)iVar52;
        alVar96[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar96,len);
        alVar97[0] = (long)iVar52;
        alVar97[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar97,len);
        alVar98[0] = (long)iVar52;
        alVar98[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,alVar98,len);
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar52; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 8; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            local_10e8 = (long)(-(gap * (h.m[1]._0_4_ * iVar52 + k)) - open);
            local_10e0 = local_10e8;
            if (local_10e8 < -0x8000) {
              local_10e0 = -0x8000;
            }
            *(short *)((long)&e + (long)(int)h.m[1]._0_4_ * 2 + 8) = (short)local_10e0;
            local_10e8 = local_10e8 - open;
            if (local_10e8 < -0x8000) {
              local_10e8 = -0x8000;
            }
            *(short *)((long)&tmp + (long)(int)h.m[1]._0_4_ * 2) = (short)local_10e8;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar54 = -(gap * (k + -1)) - open;
          if (iVar54 < -0x8000) {
            iVar54 = -0x8000;
          }
          ptr_00[k] = (int16_t)iVar54;
        }
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xfffffffffffff0d8 = ZEXT816(0);
          stack0xfffffffffffff0c8 = ZEXT816(0);
          vFL[0] = 0x1000100010001;
          vH[1] = 0x1000100010001;
          uVar62 = pvHLoad[iVar52 + -1][0];
          uVar76 = pvHMLoad[iVar52 + -1][0];
          uVar16 = pvHSLoad[iVar52 + -1][0];
          uVar17 = pvHLLoad[iVar52 + -1][0];
          vH[0] = pvHLoad[iVar52 + -1][1] << 0x10 | uVar62 >> 0x30;
          vHM[0] = pvHMLoad[iVar52 + -1][1] << 0x10 | uVar76 >> 0x30;
          vHS[1] = uVar76 << 0x10;
          vHS[0] = pvHSLoad[iVar52 + -1][1] << 0x10 | uVar16 >> 0x30;
          vHL[1] = uVar16 << 0x10;
          vHL[0] = pvHLLoad[iVar52 + -1][1] << 0x10 | uVar17 >> 0x30;
          vP = (__m128i *)(uVar17 << 0x10);
          vH_dag[1] = uVar62 << 0x10 | (ulong)(ushort)ptr_00[s1Len];
          iVar57 = ppVar2->mapper[(byte)s2[s1Len]] * iVar52;
          iVar54 = ppVar2->mapper[(byte)s2[s1Len]];
          iVar1 = ppVar2->mapper[(byte)s2[s1Len]];
          palVar6 = pvHMStore;
          palVar7 = pvHSStore;
          palVar8 = pvHLStore;
          palVar9 = pvE;
          vF_ext[1] = (longlong)ppVar12;
          vF[0] = lVar15;
          for (k = 0; k < iVar52; k = k + 1) {
            palVar55 = ptr + k;
            lVar18 = (*palVar55)[0];
            lVar19 = (*palVar55)[1];
            alVar93 = *palVar55;
            alVar97 = b[k];
            alVar94 = b[k];
            alVar98 = b_00[k];
            alVar95 = b_00[k];
            alVar99 = b_01[k];
            alVar96 = b_01[k];
            auVar86._8_8_ = vH[0];
            auVar86._0_8_ = vH_dag[1];
            auVar63 = paddsw(auVar86,*(undefined1 (*) [16])
                                      ((long)pvVar3 + (long)k * 0x10 + (long)iVar57 * 0x10));
            local_6f8 = auVar63._0_2_;
            uStack_6f6 = auVar63._2_2_;
            uStack_6f4 = auVar63._4_2_;
            uStack_6f2 = auVar63._6_2_;
            uStack_6f0 = auVar63._8_2_;
            uStack_6ee = auVar63._10_2_;
            uStack_6ec = auVar63._12_2_;
            uStack_6ea = auVar63._14_2_;
            local_708 = (short)lVar18;
            sStack_706 = (short)((ulong)lVar18 >> 0x10);
            sStack_704 = (short)((ulong)lVar18 >> 0x20);
            sStack_702 = (short)((ulong)lVar18 >> 0x30);
            sStack_700 = (short)lVar19;
            sStack_6fe = (short)((ulong)lVar19 >> 0x10);
            sStack_6fc = (short)((ulong)lVar19 >> 0x20);
            sStack_6fa = (short)((ulong)lVar19 >> 0x30);
            uVar59 = (ushort)((short)local_6f8 < local_708) * local_708 |
                     ((short)local_6f8 >= local_708) * local_6f8;
            uVar64 = (ushort)((short)uStack_6f6 < sStack_706) * sStack_706 |
                     ((short)uStack_6f6 >= sStack_706) * uStack_6f6;
            uVar67 = (ushort)((short)uStack_6f4 < sStack_704) * sStack_704 |
                     ((short)uStack_6f4 >= sStack_704) * uStack_6f4;
            uVar70 = (ushort)((short)uStack_6f2 < sStack_702) * sStack_702 |
                     ((short)uStack_6f2 >= sStack_702) * uStack_6f2;
            uVar73 = (ushort)((short)uStack_6f0 < sStack_700) * sStack_700 |
                     ((short)uStack_6f0 >= sStack_700) * uStack_6f0;
            uVar77 = (ushort)((short)uStack_6ee < sStack_6fe) * sStack_6fe |
                     ((short)uStack_6ee >= sStack_6fe) * uStack_6ee;
            uVar80 = (ushort)((short)uStack_6ec < sStack_6fc) * sStack_6fc |
                     ((short)uStack_6ec >= sStack_6fc) * uStack_6ec;
            uVar83 = (ushort)((short)uStack_6ea < sStack_6fa) * sStack_6fa |
                     ((short)uStack_6ea >= sStack_6fa) * uStack_6ea;
            local_728 = (ushort)vF_ext[1];
            uStack_726 = (ushort)((ulong)vF_ext[1] >> 0x10);
            uStack_724 = (ushort)((ulong)vF_ext[1] >> 0x20);
            uStack_722 = (ushort)((ulong)vF_ext[1] >> 0x30);
            uStack_720 = (ushort)vF[0];
            uStack_71e = (ushort)((ulong)vF[0] >> 0x10);
            uStack_71c = (ushort)((ulong)vF[0] >> 0x20);
            uStack_71a = (ushort)((ulong)vF[0] >> 0x30);
            uVar59 = ((short)uVar59 < (short)local_728) * local_728 |
                     ((short)uVar59 >= (short)local_728) * uVar59;
            uVar64 = ((short)uVar64 < (short)uStack_726) * uStack_726 |
                     ((short)uVar64 >= (short)uStack_726) * uVar64;
            uVar67 = ((short)uVar67 < (short)uStack_724) * uStack_724 |
                     ((short)uVar67 >= (short)uStack_724) * uVar67;
            uVar70 = ((short)uVar70 < (short)uStack_722) * uStack_722 |
                     ((short)uVar70 >= (short)uStack_722) * uVar70;
            uVar73 = ((short)uVar73 < (short)uStack_720) * uStack_720 |
                     ((short)uVar73 >= (short)uStack_720) * uVar73;
            uVar77 = ((short)uVar77 < (short)uStack_71e) * uStack_71e |
                     ((short)uVar77 >= (short)uStack_71e) * uVar77;
            uVar80 = ((short)uVar80 < (short)uStack_71c) * uStack_71c |
                     ((short)uVar80 >= (short)uStack_71c) * uVar80;
            uVar83 = ((short)uVar83 < (short)uStack_71a) * uStack_71a |
                     ((short)uVar83 >= (short)uStack_71a) * uVar83;
            vH_dag[1]._0_4_ = CONCAT22(uVar64,uVar59);
            vH_dag[1]._0_6_ = CONCAT24(uVar67,(undefined4)vH_dag[1]);
            vH_dag[1] = CONCAT26(uVar70,(undefined6)vH_dag[1]);
            vH[0]._0_4_ = CONCAT22(uVar77,uVar73);
            vH[0]._0_6_ = CONCAT24(uVar80,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar83,(undefined6)vH[0]);
            pvHMStore[k][0] = vH_dag[1];
            pvHMStore[k][1] = vH[0];
            sVar60 = -(ushort)(uVar59 == local_6f8);
            sVar65 = -(ushort)(uVar64 == uStack_6f6);
            sVar68 = -(ushort)(uVar67 == uStack_6f4);
            sVar71 = -(ushort)(uVar70 == uStack_6f2);
            sVar74 = -(ushort)(uVar73 == uStack_6f0);
            sVar78 = -(ushort)(uVar77 == uStack_6ee);
            sVar81 = -(ushort)(uVar80 == uStack_6ec);
            sVar84 = -(ushort)(uVar83 == uStack_6ea);
            sVar61 = -(ushort)(uVar59 == local_728);
            sVar66 = -(ushort)(uVar64 == uStack_726);
            sVar69 = -(ushort)(uVar67 == uStack_724);
            sVar72 = -(ushort)(uVar70 == uStack_722);
            sVar75 = -(ushort)(uVar73 == uStack_720);
            sVar79 = -(ushort)(uVar77 == uStack_71e);
            sVar82 = -(ushort)(uVar80 == uStack_71c);
            sVar85 = -(ushort)(uVar83 == uStack_71a);
            auVar38._2_2_ = sVar66;
            auVar38._0_2_ = sVar61;
            auVar38._4_2_ = sVar69;
            auVar38._6_2_ = sVar72;
            auVar38._10_2_ = sVar79;
            auVar38._8_2_ = sVar75;
            auVar38._12_2_ = sVar82;
            auVar38._14_2_ = sVar85;
            auVar91 = pblendvb((undefined1  [16])alVar97,stack0xfffffffffffff0d8,auVar38);
            auVar63 = paddsw((undefined1  [16])stack0xfffffffffffff088,
                             *(undefined1 (*) [16])
                              ((long)pvVar4 + (long)k * 0x10 + (long)(iVar54 * iVar52) * 0x10));
            auVar37._2_2_ = sVar65;
            auVar37._0_2_ = sVar60;
            auVar37._4_2_ = sVar68;
            auVar37._6_2_ = sVar71;
            auVar37._10_2_ = sVar78;
            auVar37._8_2_ = sVar74;
            auVar37._12_2_ = sVar81;
            auVar37._14_2_ = sVar84;
            auVar86 = pblendvb(auVar91,auVar63,auVar37);
            vHS[1] = auVar86._0_8_;
            vHM[0] = auVar86._8_8_;
            pvHSStore[k][0] = vHS[1];
            pvHSStore[k][1] = vHM[0];
            auVar36._2_2_ = sVar66;
            auVar36._0_2_ = sVar61;
            auVar36._4_2_ = sVar69;
            auVar36._6_2_ = sVar72;
            auVar36._10_2_ = sVar79;
            auVar36._8_2_ = sVar75;
            auVar36._12_2_ = sVar82;
            auVar36._14_2_ = sVar85;
            auVar91 = pblendvb((undefined1  [16])alVar98,stack0xfffffffffffff0c8,auVar36);
            auVar63 = paddsw((undefined1  [16])stack0xfffffffffffff078,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar1 * iVar52) * 0x10));
            auVar35._2_2_ = sVar65;
            auVar35._0_2_ = sVar60;
            auVar35._4_2_ = sVar68;
            auVar35._6_2_ = sVar71;
            auVar35._10_2_ = sVar78;
            auVar35._8_2_ = sVar74;
            auVar35._12_2_ = sVar81;
            auVar35._14_2_ = sVar84;
            auVar87 = pblendvb(auVar91,auVar63,auVar35);
            vHL[1] = auVar87._0_8_;
            vHS[0] = auVar87._8_8_;
            pvHLStore[k][0] = vHL[1];
            pvHLStore[k][1] = vHS[0];
            auVar34._2_2_ = sVar66;
            auVar34._0_2_ = sVar61;
            auVar34._4_2_ = sVar69;
            auVar34._6_2_ = sVar72;
            auVar34._10_2_ = sVar79;
            auVar34._8_2_ = sVar75;
            auVar34._12_2_ = sVar82;
            auVar34._14_2_ = sVar85;
            auVar91 = pblendvb((undefined1  [16])alVar99,stack0xfffffffffffff0b8,auVar34);
            auVar88._8_8_ = 0x1000100010001;
            auVar88._0_8_ = 0x1000100010001;
            auVar63 = paddsw((undefined1  [16])_vP,auVar88);
            auVar33._2_2_ = sVar65;
            auVar33._0_2_ = sVar60;
            auVar33._4_2_ = sVar68;
            auVar33._6_2_ = sVar71;
            auVar33._10_2_ = sVar78;
            auVar33._8_2_ = sVar74;
            auVar33._12_2_ = sVar81;
            auVar33._14_2_ = sVar84;
            auVar88 = pblendvb(auVar91,auVar63,auVar33);
            vP = auVar88._0_8_;
            vHL[0] = auVar88._8_8_;
            pvE[k][0] = (longlong)vP;
            pvE[k][1] = vHL[0];
            local_2b8 = (short)vSaturationCheckMax[1];
            sStack_2b6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_2b4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_2b2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_2b0 = (short)vSaturationCheckMin[0];
            sStack_2ae = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_2ac = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_2aa = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22(((short)uVar64 < sStack_2b6) * uVar64 |
                          (ushort)((short)uVar64 >= sStack_2b6) * sStack_2b6,
                          ((short)uVar59 < local_2b8) * uVar59 |
                          (ushort)((short)uVar59 >= local_2b8) * local_2b8);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24(((short)uVar67 < sStack_2b4) * uVar67 |
                          (ushort)((short)uVar67 >= sStack_2b4) * sStack_2b4,
                          (undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar70 < sStack_2b2) * uVar70 |
                          (ushort)((short)uVar70 >= sStack_2b2) * sStack_2b2,
                          (undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22(((short)uVar77 < sStack_2ae) * uVar77 |
                          (ushort)((short)uVar77 >= sStack_2ae) * sStack_2ae,
                          ((short)uVar73 < sStack_2b0) * uVar73 |
                          (ushort)((short)uVar73 >= sStack_2b0) * sStack_2b0);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24(((short)uVar80 < sStack_2ac) * uVar80 |
                          (ushort)((short)uVar80 >= sStack_2ac) * sStack_2ac,
                          (undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar83 < sStack_2aa) * uVar83 |
                          (ushort)((short)uVar83 >= sStack_2aa) * sStack_2aa,
                          (undefined6)vSaturationCheckMin[0]);
            local_738 = (short)result;
            sStack_736 = (short)((ulong)result >> 0x10);
            sStack_734 = (short)((ulong)result >> 0x20);
            sStack_732 = (short)((ulong)result >> 0x30);
            sStack_730 = (short)vSaturationCheckMax[0];
            sStack_72e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_72c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_72a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            uVar59 = (local_738 < (short)uVar59) * uVar59 |
                     (ushort)(local_738 >= (short)uVar59) * local_738;
            uVar64 = (sStack_736 < (short)uVar64) * uVar64 |
                     (ushort)(sStack_736 >= (short)uVar64) * sStack_736;
            uVar67 = (sStack_734 < (short)uVar67) * uVar67 |
                     (ushort)(sStack_734 >= (short)uVar67) * sStack_734;
            uVar70 = (sStack_732 < (short)uVar70) * uVar70 |
                     (ushort)(sStack_732 >= (short)uVar70) * sStack_732;
            uVar73 = (sStack_730 < (short)uVar73) * uVar73 |
                     (ushort)(sStack_730 >= (short)uVar73) * sStack_730;
            uVar77 = (sStack_72e < (short)uVar77) * uVar77 |
                     (ushort)(sStack_72e >= (short)uVar77) * sStack_72e;
            uVar80 = (sStack_72c < (short)uVar80) * uVar80 |
                     (ushort)(sStack_72c >= (short)uVar80) * sStack_72c;
            uVar83 = (sStack_72a < (short)uVar83) * uVar83 |
                     (ushort)(sStack_72a >= (short)uVar83) * sStack_72a;
            local_768 = auVar86._0_2_;
            sStack_766 = auVar86._2_2_;
            sStack_764 = auVar86._4_2_;
            sStack_762 = auVar86._6_2_;
            sStack_760 = auVar86._8_2_;
            sStack_75e = auVar86._10_2_;
            sStack_75c = auVar86._12_2_;
            sStack_75a = auVar86._14_2_;
            uVar59 = (ushort)((short)uVar59 < local_768) * local_768 |
                     ((short)uVar59 >= local_768) * uVar59;
            uVar64 = (ushort)((short)uVar64 < sStack_766) * sStack_766 |
                     ((short)uVar64 >= sStack_766) * uVar64;
            uVar67 = (ushort)((short)uVar67 < sStack_764) * sStack_764 |
                     ((short)uVar67 >= sStack_764) * uVar67;
            uVar70 = (ushort)((short)uVar70 < sStack_762) * sStack_762 |
                     ((short)uVar70 >= sStack_762) * uVar70;
            uVar73 = (ushort)((short)uVar73 < sStack_760) * sStack_760 |
                     ((short)uVar73 >= sStack_760) * uVar73;
            uVar77 = (ushort)((short)uVar77 < sStack_75e) * sStack_75e |
                     ((short)uVar77 >= sStack_75e) * uVar77;
            uVar80 = (ushort)((short)uVar80 < sStack_75c) * sStack_75c |
                     ((short)uVar80 >= sStack_75c) * uVar80;
            uVar83 = (ushort)((short)uVar83 < sStack_75a) * sStack_75a |
                     ((short)uVar83 >= sStack_75a) * uVar83;
            local_788 = auVar87._0_2_;
            sStack_786 = auVar87._2_2_;
            sStack_784 = auVar87._4_2_;
            sStack_782 = auVar87._6_2_;
            sStack_780 = auVar87._8_2_;
            sStack_77e = auVar87._10_2_;
            sStack_77c = auVar87._12_2_;
            sStack_77a = auVar87._14_2_;
            uVar59 = (ushort)((short)uVar59 < local_788) * local_788 |
                     ((short)uVar59 >= local_788) * uVar59;
            uVar64 = (ushort)((short)uVar64 < sStack_786) * sStack_786 |
                     ((short)uVar64 >= sStack_786) * uVar64;
            uVar67 = (ushort)((short)uVar67 < sStack_784) * sStack_784 |
                     ((short)uVar67 >= sStack_784) * uVar67;
            uVar70 = (ushort)((short)uVar70 < sStack_782) * sStack_782 |
                     ((short)uVar70 >= sStack_782) * uVar70;
            uVar73 = (ushort)((short)uVar73 < sStack_780) * sStack_780 |
                     ((short)uVar73 >= sStack_780) * uVar73;
            uVar77 = (ushort)((short)uVar77 < sStack_77e) * sStack_77e |
                     ((short)uVar77 >= sStack_77e) * uVar77;
            uVar80 = (ushort)((short)uVar80 < sStack_77c) * sStack_77c |
                     ((short)uVar80 >= sStack_77c) * uVar80;
            uVar83 = (ushort)((short)uVar83 < sStack_77a) * sStack_77a |
                     ((short)uVar83 >= sStack_77a) * uVar83;
            local_7a8 = auVar88._0_2_;
            sStack_7a6 = auVar88._2_2_;
            sStack_7a4 = auVar88._4_2_;
            sStack_7a2 = auVar88._6_2_;
            sStack_7a0 = auVar88._8_2_;
            sStack_79e = auVar88._10_2_;
            sStack_79c = auVar88._12_2_;
            sStack_79a = auVar88._14_2_;
            result._0_4_ = CONCAT22((ushort)((short)uVar64 < sStack_7a6) * sStack_7a6 |
                                    ((short)uVar64 >= sStack_7a6) * uVar64,
                                    (ushort)((short)uVar59 < local_7a8) * local_7a8 |
                                    ((short)uVar59 >= local_7a8) * uVar59);
            result._0_6_ = CONCAT24((ushort)((short)uVar67 < sStack_7a4) * sStack_7a4 |
                                    ((short)uVar67 >= sStack_7a4) * uVar67,result._0_4_);
            result = (parasail_result_t *)
                     CONCAT26((ushort)((short)uVar70 < sStack_7a2) * sStack_7a2 |
                              ((short)uVar70 >= sStack_7a2) * uVar70,result._0_6_);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT22((ushort)((short)uVar77 < sStack_79e) * sStack_79e |
                          ((short)uVar77 >= sStack_79e) * uVar77,
                          (ushort)((short)uVar73 < sStack_7a0) * sStack_7a0 |
                          ((short)uVar73 >= sStack_7a0) * uVar73);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT24((ushort)((short)uVar80 < sStack_79c) * sStack_79c |
                          ((short)uVar80 >= sStack_79c) * uVar80,(undefined4)vSaturationCheckMax[0])
            ;
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)((short)uVar83 < sStack_79a) * sStack_79a |
                          ((short)uVar83 >= sStack_79a) * uVar83,(undefined6)vSaturationCheckMax[0])
            ;
            auVar47._8_8_ = vH[0];
            auVar47._0_8_ = vH_dag[1];
            auVar46._8_8_ = uVar13;
            auVar46._0_8_ = uVar10;
            auVar63 = psubsw(auVar47,auVar46);
            auVar45._8_8_ = uVar14;
            auVar45._0_8_ = uVar11;
            auVar91 = psubsw((undefined1  [16])alVar93,auVar45);
            local_7b8 = auVar63._0_2_;
            sStack_7b6 = auVar63._2_2_;
            sStack_7b4 = auVar63._4_2_;
            sStack_7b2 = auVar63._6_2_;
            sStack_7b0 = auVar63._8_2_;
            sStack_7ae = auVar63._10_2_;
            sStack_7ac = auVar63._12_2_;
            sStack_7aa = auVar63._14_2_;
            local_7c8 = auVar91._0_2_;
            sStack_7c6 = auVar91._2_2_;
            sStack_7c4 = auVar91._4_2_;
            sStack_7c2 = auVar91._6_2_;
            sStack_7c0 = auVar91._8_2_;
            sStack_7be = auVar91._10_2_;
            sStack_7bc = auVar91._12_2_;
            sStack_7ba = auVar91._14_2_;
            vE_ext[1] = CONCAT26((ushort)(sStack_7b2 < sStack_7c2) * sStack_7c2 |
                                 (ushort)(sStack_7b2 >= sStack_7c2) * sStack_7b2,
                                 CONCAT24((ushort)(sStack_7b4 < sStack_7c4) * sStack_7c4 |
                                          (ushort)(sStack_7b4 >= sStack_7c4) * sStack_7b4,
                                          CONCAT22((ushort)(sStack_7b6 < sStack_7c6) * sStack_7c6 |
                                                   (ushort)(sStack_7b6 >= sStack_7c6) * sStack_7b6,
                                                   (ushort)(local_7b8 < local_7c8) * local_7c8 |
                                                   (ushort)(local_7b8 >= local_7c8) * local_7b8)));
            vE[0] = CONCAT26((ushort)(sStack_7aa < sStack_7ba) * sStack_7ba |
                             (ushort)(sStack_7aa >= sStack_7ba) * sStack_7aa,
                             CONCAT24((ushort)(sStack_7ac < sStack_7bc) * sStack_7bc |
                                      (ushort)(sStack_7ac >= sStack_7bc) * sStack_7ac,
                                      CONCAT22((ushort)(sStack_7ae < sStack_7be) * sStack_7be |
                                               (ushort)(sStack_7ae >= sStack_7be) * sStack_7ae,
                                               (ushort)(sStack_7b0 < sStack_7c0) * sStack_7c0 |
                                               (ushort)(sStack_7b0 >= sStack_7c0) * sStack_7b0)));
            sVar60 = -(ushort)(local_7c8 < local_7b8);
            sVar61 = -(ushort)(sStack_7c6 < sStack_7b6);
            sVar65 = -(ushort)(sStack_7c4 < sStack_7b4);
            sVar66 = -(ushort)(sStack_7c2 < sStack_7b2);
            sVar68 = -(ushort)(sStack_7c0 < sStack_7b0);
            sVar69 = -(ushort)(sStack_7be < sStack_7ae);
            sVar71 = -(ushort)(sStack_7bc < sStack_7ac);
            sVar72 = -(ushort)(sStack_7ba < sStack_7aa);
            auVar32._2_2_ = sVar61;
            auVar32._0_2_ = sVar60;
            auVar32._4_2_ = sVar65;
            auVar32._6_2_ = sVar66;
            auVar32._10_2_ = sVar69;
            auVar32._8_2_ = sVar68;
            auVar32._12_2_ = sVar71;
            auVar32._14_2_ = sVar72;
            auVar63 = pblendvb((undefined1  [16])alVar94,auVar86,auVar32);
            auVar31._2_2_ = sVar61;
            auVar31._0_2_ = sVar60;
            auVar31._4_2_ = sVar65;
            auVar31._6_2_ = sVar66;
            auVar31._10_2_ = sVar69;
            auVar31._8_2_ = sVar68;
            auVar31._12_2_ = sVar71;
            auVar31._14_2_ = sVar72;
            auVar91 = pblendvb((undefined1  [16])alVar95,auVar87,auVar31);
            auVar92._8_8_ = 0x1000100010001;
            auVar92._0_8_ = 0x1000100010001;
            auVar92 = paddsw((undefined1  [16])alVar96,auVar92);
            auVar89._8_8_ = 0x1000100010001;
            auVar89._0_8_ = 0x1000100010001;
            auVar89 = paddsw(auVar88,auVar89);
            auVar30._2_2_ = sVar61;
            auVar30._0_2_ = sVar60;
            auVar30._4_2_ = sVar65;
            auVar30._6_2_ = sVar66;
            auVar30._10_2_ = sVar69;
            auVar30._8_2_ = sVar68;
            auVar30._12_2_ = sVar71;
            auVar30._14_2_ = sVar72;
            auVar89 = pblendvb(auVar92,auVar89,auVar30);
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            vES[1] = auVar63._0_8_;
            vEM[0] = auVar63._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar91._0_8_;
            vES[0] = auVar91._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            vF[1] = auVar89._0_8_;
            vEL[0] = auVar89._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            auVar44._8_8_ = vF[0];
            auVar44._0_8_ = vF_ext[1];
            auVar43._8_8_ = uVar14;
            auVar43._0_8_ = uVar11;
            auVar63 = psubsw(auVar44,auVar43);
            local_7e8 = auVar63._0_2_;
            sStack_7e6 = auVar63._2_2_;
            sStack_7e4 = auVar63._4_2_;
            sStack_7e2 = auVar63._6_2_;
            sStack_7e0 = auVar63._8_2_;
            sStack_7de = auVar63._10_2_;
            sStack_7dc = auVar63._12_2_;
            sStack_7da = auVar63._14_2_;
            vF_ext[1] = CONCAT26((ushort)(sStack_7b2 < sStack_7e2) * sStack_7e2 |
                                 (ushort)(sStack_7b2 >= sStack_7e2) * sStack_7b2,
                                 CONCAT24((ushort)(sStack_7b4 < sStack_7e4) * sStack_7e4 |
                                          (ushort)(sStack_7b4 >= sStack_7e4) * sStack_7b4,
                                          CONCAT22((ushort)(sStack_7b6 < sStack_7e6) * sStack_7e6 |
                                                   (ushort)(sStack_7b6 >= sStack_7e6) * sStack_7b6,
                                                   (ushort)(local_7b8 < local_7e8) * local_7e8 |
                                                   (ushort)(local_7b8 >= local_7e8) * local_7b8)));
            vF[0] = CONCAT26((ushort)(sStack_7aa < sStack_7da) * sStack_7da |
                             (ushort)(sStack_7aa >= sStack_7da) * sStack_7aa,
                             CONCAT24((ushort)(sStack_7ac < sStack_7dc) * sStack_7dc |
                                      (ushort)(sStack_7ac >= sStack_7dc) * sStack_7ac,
                                      CONCAT22((ushort)(sStack_7ae < sStack_7de) * sStack_7de |
                                               (ushort)(sStack_7ae >= sStack_7de) * sStack_7ae,
                                               (ushort)(sStack_7b0 < sStack_7e0) * sStack_7e0 |
                                               (ushort)(sStack_7b0 >= sStack_7e0) * sStack_7b0)));
            sVar60 = -(ushort)(local_7e8 < local_7b8);
            sVar61 = -(ushort)(sStack_7e6 < sStack_7b6);
            sVar65 = -(ushort)(sStack_7e4 < sStack_7b4);
            sVar66 = -(ushort)(sStack_7e2 < sStack_7b2);
            sVar68 = -(ushort)(sStack_7e0 < sStack_7b0);
            sVar69 = -(ushort)(sStack_7de < sStack_7ae);
            sVar71 = -(ushort)(sStack_7dc < sStack_7ac);
            sVar72 = -(ushort)(sStack_7da < sStack_7aa);
            auVar29._2_2_ = sVar61;
            auVar29._0_2_ = sVar60;
            auVar29._4_2_ = sVar65;
            auVar29._6_2_ = sVar66;
            auVar29._10_2_ = sVar69;
            auVar29._8_2_ = sVar68;
            auVar29._12_2_ = sVar71;
            auVar29._14_2_ = sVar72;
            register0x00001240 = pblendvb(stack0xfffffffffffff0d8,auVar86,auVar29);
            auVar28._2_2_ = sVar61;
            auVar28._0_2_ = sVar60;
            auVar28._4_2_ = sVar65;
            auVar28._6_2_ = sVar66;
            auVar28._10_2_ = sVar69;
            auVar28._8_2_ = sVar68;
            auVar28._12_2_ = sVar71;
            auVar28._14_2_ = sVar72;
            register0x00001240 = pblendvb(stack0xfffffffffffff0c8,auVar87,auVar28);
            auVar91._8_8_ = 0x1000100010001;
            auVar91._0_8_ = 0x1000100010001;
            auVar91 = paddsw(stack0xfffffffffffff0b8,auVar91);
            auVar63._8_8_ = 0x1000100010001;
            auVar63._0_8_ = 0x1000100010001;
            auVar63 = paddsw(auVar88,auVar63);
            auVar87._2_2_ = sVar61;
            auVar87._0_2_ = sVar60;
            auVar87._4_2_ = sVar65;
            auVar87._6_2_ = sVar66;
            auVar87._10_2_ = sVar69;
            auVar87._8_2_ = sVar68;
            auVar87._12_2_ = sVar71;
            auVar87._14_2_ = sVar72;
            register0x00001240 = pblendvb(auVar91,auVar63,auVar87);
            vH_dag[1] = pvHLoad[k][0];
            vH[0] = pvHLoad[k][1];
            unique0x10004795 = pvHMLoad[k];
            unique0x100047a5 = pvHSLoad[k];
            _vP = pvHLLoad[k];
          }
          for (end_query = 0; end_query < 8; end_query = end_query + 1) {
            uVar62 = pvHLoad[iVar52 + -1][0];
            local_10f8 = (ulong)(ptr_00[s1Len + 1] - open);
            if ((long)local_10f8 < -0x8000) {
              local_10f8 = 0xffffffffffff8000;
            }
            vF[0] = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            vFM[0] = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
            vFS[1] = vFS[1] << 0x10;
            vFS[0] = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
            vFL[1] = vFL[1] << 0x10;
            vHp[0] = pvHLoad[iVar52 + -1][1] << 0x10 | uVar62 >> 0x30;
            tmp_6 = uVar62 << 0x10 | (ulong)(ushort)ptr_00[s1Len];
            vF_ext[1] = vF_ext[1] << 0x10 | local_10f8 & 0xffff;
            vFL[0] = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
            vH[1] = vH[1] << 0x10 | 1;
            for (k = 0; k < iVar52; k = k + 1) {
              auVar63 = paddsw((undefined1  [16])_tmp_6,
                               *(undefined1 (*) [16])
                                ((long)pvVar3 + (long)k * 0x10 + (long)iVar57 * 0x10));
              lVar18 = pvHMStore[k][0];
              lVar19 = pvHMStore[k][1];
              local_7f8 = (short)lVar18;
              sStack_7f6 = (short)((ulong)lVar18 >> 0x10);
              sStack_7f4 = (short)((ulong)lVar18 >> 0x20);
              sStack_7f2 = (short)((ulong)lVar18 >> 0x30);
              sStack_7f0 = (short)lVar19;
              sStack_7ee = (short)((ulong)lVar19 >> 0x10);
              sStack_7ec = (short)((ulong)lVar19 >> 0x20);
              sStack_7ea = (short)((ulong)lVar19 >> 0x30);
              local_808 = (ushort)vF_ext[1];
              uStack_806 = (ushort)((ulong)vF_ext[1] >> 0x10);
              uStack_804 = (ushort)((ulong)vF_ext[1] >> 0x20);
              uStack_802 = (ushort)((ulong)vF_ext[1] >> 0x30);
              uStack_800 = (ushort)vF[0];
              uStack_7fe = (ushort)((ulong)vF[0] >> 0x10);
              uStack_7fc = (ushort)((ulong)vF[0] >> 0x20);
              uStack_7fa = (ushort)((ulong)vF[0] >> 0x30);
              uVar59 = (local_7f8 < (short)local_808) * local_808 |
                       (ushort)(local_7f8 >= (short)local_808) * local_7f8;
              uVar64 = (sStack_7f6 < (short)uStack_806) * uStack_806 |
                       (ushort)(sStack_7f6 >= (short)uStack_806) * sStack_7f6;
              uVar67 = (sStack_7f4 < (short)uStack_804) * uStack_804 |
                       (ushort)(sStack_7f4 >= (short)uStack_804) * sStack_7f4;
              uVar70 = (sStack_7f2 < (short)uStack_802) * uStack_802 |
                       (ushort)(sStack_7f2 >= (short)uStack_802) * sStack_7f2;
              uVar73 = (sStack_7f0 < (short)uStack_800) * uStack_800 |
                       (ushort)(sStack_7f0 >= (short)uStack_800) * sStack_7f0;
              uVar77 = (sStack_7ee < (short)uStack_7fe) * uStack_7fe |
                       (ushort)(sStack_7ee >= (short)uStack_7fe) * sStack_7ee;
              uVar80 = (sStack_7ec < (short)uStack_7fc) * uStack_7fc |
                       (ushort)(sStack_7ec >= (short)uStack_7fc) * sStack_7ec;
              uVar83 = (sStack_7ea < (short)uStack_7fa) * uStack_7fa |
                       (ushort)(sStack_7ea >= (short)uStack_7fa) * sStack_7ea;
              vH_dag[1]._0_4_ = CONCAT22(uVar64,uVar59);
              vH_dag[1]._0_6_ = CONCAT24(uVar67,(undefined4)vH_dag[1]);
              vH_dag[1] = CONCAT26(uVar70,(undefined6)vH_dag[1]);
              vH[0]._0_4_ = CONCAT22(uVar77,uVar73);
              vH[0]._0_6_ = CONCAT24(uVar80,(undefined4)vH[0]);
              vH[0] = CONCAT26(uVar83,(undefined6)vH[0]);
              pvHMStore[k][0] = vH_dag[1];
              pvHMStore[k][1] = vH[0];
              local_6a8 = auVar63._0_2_;
              uStack_6a6 = auVar63._2_2_;
              uStack_6a4 = auVar63._4_2_;
              uStack_6a2 = auVar63._6_2_;
              uStack_6a0 = auVar63._8_2_;
              uStack_69e = auVar63._10_2_;
              uStack_69c = auVar63._12_2_;
              uStack_69a = auVar63._14_2_;
              uVar62 = ~CONCAT26(-(ushort)(uVar70 == uStack_6a2),
                                 CONCAT24(-(ushort)(uVar67 == uStack_6a4),
                                          CONCAT22(-(ushort)(uVar64 == uStack_6a6),
                                                   -(ushort)(uVar59 == local_6a8)))) &
                       CONCAT26(-(ushort)(uVar70 == uStack_802),
                                CONCAT24(-(ushort)(uVar67 == uStack_804),
                                         CONCAT22(-(ushort)(uVar64 == uStack_806),
                                                  -(ushort)(uVar59 == local_808))));
              uVar76 = ~CONCAT26(-(ushort)(uVar83 == uStack_69a),
                                 CONCAT24(-(ushort)(uVar80 == uStack_69c),
                                          CONCAT22(-(ushort)(uVar77 == uStack_69e),
                                                   -(ushort)(uVar73 == uStack_6a0)))) &
                       CONCAT26(-(ushort)(uVar83 == uStack_7fa),
                                CONCAT24(-(ushort)(uVar80 == uStack_7fc),
                                         CONCAT22(-(ushort)(uVar77 == uStack_7fe),
                                                  -(ushort)(uVar73 == uStack_800))));
              auVar27._8_8_ = uVar76;
              auVar27._0_8_ = uVar62;
              auVar89 = pblendvb((undefined1  [16])pvHSStore[k],stack0xfffffffffffff0d8,auVar27);
              vHS[1] = auVar89._0_8_;
              vHM[0] = auVar89._8_8_;
              pvHSStore[k][0] = vHS[1];
              pvHSStore[k][1] = vHM[0];
              auVar26._8_8_ = uVar76;
              auVar26._0_8_ = uVar62;
              auVar92 = pblendvb((undefined1  [16])pvHLStore[k],stack0xfffffffffffff0c8,auVar26);
              vHL[1] = auVar92._0_8_;
              vHS[0] = auVar92._8_8_;
              pvHLStore[k][0] = vHL[1];
              pvHLStore[k][1] = vHS[0];
              auVar25._8_8_ = uVar76;
              auVar25._0_8_ = uVar62;
              auVar88 = pblendvb((undefined1  [16])pvE[k],stack0xfffffffffffff0b8,auVar25);
              vP = auVar88._0_8_;
              vHL[0] = auVar88._8_8_;
              pvE[k][0] = (longlong)vP;
              pvE[k][1] = vHL[0];
              local_2d8 = (short)vSaturationCheckMax[1];
              sStack_2d6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_2d4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_2d2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_2d0 = (short)vSaturationCheckMin[0];
              sStack_2ce = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_2cc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_2ca = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT22(((short)uVar64 < sStack_2d6) * uVar64 |
                            (ushort)((short)uVar64 >= sStack_2d6) * sStack_2d6,
                            ((short)uVar59 < local_2d8) * uVar59 |
                            (ushort)((short)uVar59 >= local_2d8) * local_2d8);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT24(((short)uVar67 < sStack_2d4) * uVar67 |
                            (ushort)((short)uVar67 >= sStack_2d4) * sStack_2d4,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT26(((short)uVar70 < sStack_2d2) * uVar70 |
                            (ushort)((short)uVar70 >= sStack_2d2) * sStack_2d2,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT22(((short)uVar77 < sStack_2ce) * uVar77 |
                            (ushort)((short)uVar77 >= sStack_2ce) * sStack_2ce,
                            ((short)uVar73 < sStack_2d0) * uVar73 |
                            (ushort)((short)uVar73 >= sStack_2d0) * sStack_2d0);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT24(((short)uVar80 < sStack_2cc) * uVar80 |
                            (ushort)((short)uVar80 >= sStack_2cc) * sStack_2cc,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT26(((short)uVar83 < sStack_2ca) * uVar83 |
                            (ushort)((short)uVar83 >= sStack_2ca) * sStack_2ca,
                            (undefined6)vSaturationCheckMin[0]);
              local_818 = (short)result;
              sStack_816 = (short)((ulong)result >> 0x10);
              sStack_814 = (short)((ulong)result >> 0x20);
              sStack_812 = (short)((ulong)result >> 0x30);
              sStack_810 = (short)vSaturationCheckMax[0];
              sStack_80e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_80c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_80a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              uVar59 = (local_818 < (short)uVar59) * uVar59 |
                       (ushort)(local_818 >= (short)uVar59) * local_818;
              uVar64 = (sStack_816 < (short)uVar64) * uVar64 |
                       (ushort)(sStack_816 >= (short)uVar64) * sStack_816;
              uVar67 = (sStack_814 < (short)uVar67) * uVar67 |
                       (ushort)(sStack_814 >= (short)uVar67) * sStack_814;
              uVar70 = (sStack_812 < (short)uVar70) * uVar70 |
                       (ushort)(sStack_812 >= (short)uVar70) * sStack_812;
              uVar73 = (sStack_810 < (short)uVar73) * uVar73 |
                       (ushort)(sStack_810 >= (short)uVar73) * sStack_810;
              uVar77 = (sStack_80e < (short)uVar77) * uVar77 |
                       (ushort)(sStack_80e >= (short)uVar77) * sStack_80e;
              uVar80 = (sStack_80c < (short)uVar80) * uVar80 |
                       (ushort)(sStack_80c >= (short)uVar80) * sStack_80c;
              uVar83 = (sStack_80a < (short)uVar83) * uVar83 |
                       (ushort)(sStack_80a >= (short)uVar83) * sStack_80a;
              local_848 = auVar89._0_2_;
              sStack_846 = auVar89._2_2_;
              sStack_844 = auVar89._4_2_;
              sStack_842 = auVar89._6_2_;
              sStack_840 = auVar89._8_2_;
              sStack_83e = auVar89._10_2_;
              sStack_83c = auVar89._12_2_;
              sStack_83a = auVar89._14_2_;
              uVar59 = (ushort)((short)uVar59 < local_848) * local_848 |
                       ((short)uVar59 >= local_848) * uVar59;
              uVar64 = (ushort)((short)uVar64 < sStack_846) * sStack_846 |
                       ((short)uVar64 >= sStack_846) * uVar64;
              uVar67 = (ushort)((short)uVar67 < sStack_844) * sStack_844 |
                       ((short)uVar67 >= sStack_844) * uVar67;
              uVar70 = (ushort)((short)uVar70 < sStack_842) * sStack_842 |
                       ((short)uVar70 >= sStack_842) * uVar70;
              uVar73 = (ushort)((short)uVar73 < sStack_840) * sStack_840 |
                       ((short)uVar73 >= sStack_840) * uVar73;
              uVar77 = (ushort)((short)uVar77 < sStack_83e) * sStack_83e |
                       ((short)uVar77 >= sStack_83e) * uVar77;
              uVar80 = (ushort)((short)uVar80 < sStack_83c) * sStack_83c |
                       ((short)uVar80 >= sStack_83c) * uVar80;
              uVar83 = (ushort)((short)uVar83 < sStack_83a) * sStack_83a |
                       ((short)uVar83 >= sStack_83a) * uVar83;
              local_868 = auVar92._0_2_;
              sStack_866 = auVar92._2_2_;
              sStack_864 = auVar92._4_2_;
              sStack_862 = auVar92._6_2_;
              sStack_860 = auVar92._8_2_;
              sStack_85e = auVar92._10_2_;
              sStack_85c = auVar92._12_2_;
              sStack_85a = auVar92._14_2_;
              uVar59 = (ushort)((short)uVar59 < local_868) * local_868 |
                       ((short)uVar59 >= local_868) * uVar59;
              uVar64 = (ushort)((short)uVar64 < sStack_866) * sStack_866 |
                       ((short)uVar64 >= sStack_866) * uVar64;
              uVar67 = (ushort)((short)uVar67 < sStack_864) * sStack_864 |
                       ((short)uVar67 >= sStack_864) * uVar67;
              uVar70 = (ushort)((short)uVar70 < sStack_862) * sStack_862 |
                       ((short)uVar70 >= sStack_862) * uVar70;
              uVar73 = (ushort)((short)uVar73 < sStack_860) * sStack_860 |
                       ((short)uVar73 >= sStack_860) * uVar73;
              uVar77 = (ushort)((short)uVar77 < sStack_85e) * sStack_85e |
                       ((short)uVar77 >= sStack_85e) * uVar77;
              uVar80 = (ushort)((short)uVar80 < sStack_85c) * sStack_85c |
                       ((short)uVar80 >= sStack_85c) * uVar80;
              uVar83 = (ushort)((short)uVar83 < sStack_85a) * sStack_85a |
                       ((short)uVar83 >= sStack_85a) * uVar83;
              local_888 = auVar88._0_2_;
              sStack_886 = auVar88._2_2_;
              sStack_884 = auVar88._4_2_;
              sStack_882 = auVar88._6_2_;
              sStack_880 = auVar88._8_2_;
              sStack_87e = auVar88._10_2_;
              sStack_87c = auVar88._12_2_;
              sStack_87a = auVar88._14_2_;
              result._0_4_ = CONCAT22((ushort)((short)uVar64 < sStack_886) * sStack_886 |
                                      ((short)uVar64 >= sStack_886) * uVar64,
                                      (ushort)((short)uVar59 < local_888) * local_888 |
                                      ((short)uVar59 >= local_888) * uVar59);
              result._0_6_ = CONCAT24((ushort)((short)uVar67 < sStack_884) * sStack_884 |
                                      ((short)uVar67 >= sStack_884) * uVar67,result._0_4_);
              result = (parasail_result_t *)
                       CONCAT26((ushort)((short)uVar70 < sStack_882) * sStack_882 |
                                ((short)uVar70 >= sStack_882) * uVar70,result._0_6_);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT22((ushort)((short)uVar77 < sStack_87e) * sStack_87e |
                            ((short)uVar77 >= sStack_87e) * uVar77,
                            (ushort)((short)uVar73 < sStack_880) * sStack_880 |
                            ((short)uVar73 >= sStack_880) * uVar73);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT24((ushort)((short)uVar80 < sStack_87c) * sStack_87c |
                            ((short)uVar80 >= sStack_87c) * uVar80,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)((short)uVar83 < sStack_87a) * sStack_87a |
                            ((short)uVar83 >= sStack_87a) * uVar83,
                            (undefined6)vSaturationCheckMax[0]);
              auVar42._8_8_ = vH[0];
              auVar42._0_8_ = vH_dag[1];
              auVar41._8_8_ = uVar13;
              auVar41._0_8_ = uVar10;
              auVar63 = psubsw(auVar42,auVar41);
              auVar40._8_8_ = vF[0];
              auVar40._0_8_ = vF_ext[1];
              auVar39._8_8_ = uVar14;
              auVar39._0_8_ = uVar11;
              auVar91 = psubsw(auVar40,auVar39);
              vFM[1] = auVar91._0_8_;
              vF_ext[0] = auVar91._8_8_;
              local_1b8 = auVar91._0_2_;
              sStack_1b6 = auVar91._2_2_;
              sStack_1b4 = auVar91._4_2_;
              sStack_1b2 = auVar91._6_2_;
              sStack_1b0 = auVar91._8_2_;
              sStack_1ae = auVar91._10_2_;
              sStack_1ac = auVar91._12_2_;
              sStack_1aa = auVar91._14_2_;
              local_1c8 = auVar63._0_2_;
              sStack_1c6 = auVar63._2_2_;
              sStack_1c4 = auVar63._4_2_;
              sStack_1c2 = auVar63._6_2_;
              sStack_1c0 = auVar63._8_2_;
              sStack_1be = auVar63._10_2_;
              sStack_1bc = auVar63._12_2_;
              sStack_1ba = auVar63._14_2_;
              auVar90._0_8_ =
                   CONCAT26(-(ushort)(sStack_1c2 < sStack_1b2),
                            CONCAT24(-(ushort)(sStack_1c4 < sStack_1b4),
                                     CONCAT22(-(ushort)(sStack_1c6 < sStack_1b6),
                                              -(ushort)(local_1c8 < local_1b8))));
              auVar90._8_2_ = -(ushort)(sStack_1c0 < sStack_1b0);
              auVar90._10_2_ = -(ushort)(sStack_1be < sStack_1ae);
              auVar90._12_2_ = -(ushort)(sStack_1bc < sStack_1ac);
              auVar90._14_2_ = -(ushort)(sStack_1ba < sStack_1aa);
              uStack_f0 = auVar90._8_8_;
              uStack_f0 = uStack_f0 |
                          CONCAT26(-(ushort)(sStack_1aa == sStack_1ba),
                                   CONCAT24(-(ushort)(sStack_1ac == sStack_1bc),
                                            CONCAT22(-(ushort)(sStack_1ae == sStack_1be),
                                                     -(ushort)(sStack_1b0 == sStack_1c0))));
              auVar49._8_8_ = uStack_f0;
              auVar49._0_8_ =
                   auVar90._0_8_ |
                   CONCAT26(-(ushort)(sStack_1b2 == sStack_1c2),
                            CONCAT24(-(ushort)(sStack_1b4 == sStack_1c4),
                                     CONCAT22(-(ushort)(sStack_1b6 == sStack_1c6),
                                              -(ushort)(local_1b8 == local_1c8))));
              if ((((((((((((((((auVar49 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar49 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar49 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar49 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar49 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar49 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uStack_f0 >> 7 & 1) == 0) && (uStack_f0 >> 0xf & 1) == 0) &&
                      (uStack_f0 >> 0x17 & 1) == 0) && (uStack_f0 >> 0x1f & 1) == 0) &&
                    (uStack_f0 >> 0x27 & 1) == 0) && (uStack_f0 >> 0x2f & 1) == 0) &&
                  (uStack_f0 >> 0x37 & 1) == 0) && -1 < (long)uStack_f0) goto LAB_00af5489;
              vF_ext[1] = vFM[1];
              vF[0] = vF_ext[0];
              vH_1[1] = CONCAT26(-(ushort)(sStack_1b2 < sStack_1c2),
                                 CONCAT24(-(ushort)(sStack_1b4 < sStack_1c4),
                                          CONCAT22(-(ushort)(sStack_1b6 < sStack_1c6),
                                                   -(ushort)(local_1b8 < local_1c8))));
              cond[0] = CONCAT26(-(ushort)(sStack_1aa < sStack_1ba),
                                 CONCAT24(-(ushort)(sStack_1ac < sStack_1bc),
                                          CONCAT22(-(ushort)(sStack_1ae < sStack_1be),
                                                   -(ushort)(sStack_1b0 < sStack_1c0))));
              auVar24._8_8_ = cond[0];
              auVar24._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff0d8,auVar89,auVar24);
              auVar23._8_8_ = cond[0];
              auVar23._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff0c8,auVar92,auVar23);
              auVar21._8_8_ = 0x1000100010001;
              auVar21._0_8_ = 0x1000100010001;
              auVar91 = paddsw(stack0xfffffffffffff0b8,auVar21);
              auVar20._8_8_ = 0x1000100010001;
              auVar20._0_8_ = 0x1000100010001;
              auVar63 = paddsw(auVar88,auVar20);
              auVar22._8_8_ = cond[0];
              auVar22._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(auVar91,auVar63,auVar22);
              _tmp_6 = pvHLoad[k];
            }
          }
LAB_00af5489:
          vH[0] = pvHMStore[iVar58][1];
          unique0x100048c5 = pvHSStore[iVar58];
          unique0x100048d5 = pvHLStore[iVar58];
          _vP = pvE[iVar58];
          vH_dag[1] = pvHMStore[iVar58][0];
          for (end_query = 0; end_query < iVar53; end_query = end_query + 1) {
            vH[0] = vH[0] << 0x10 | (ulong)vH_dag[1] >> 0x30;
            vHM[0] = vHM[0] << 0x10 | (ulong)vHS[1] >> 0x30;
            vHS[1] = vHS[1] << 0x10;
            vHS[0] = vHS[0] << 0x10 | (ulong)vHL[1] >> 0x30;
            vHL[1] = vHL[1] << 0x10;
            vHL[0] = vHL[0] << 0x10 | (ulong)vP >> 0x30;
            vP = (__m128i *)((long)vP << 0x10);
            vH_dag[1] = vH_dag[1] << 0x10;
          }
          *(int *)(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->trace->
                    trace_del_table + (long)s1Len * 4) = (int)vH[0]._6_2_;
          *(int *)(*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                   &_segNum->matrix)->trace->trace_del_table + 8) + (long)s1Len * 4)
               = (int)vHM[0]._6_2_;
          *(int *)(*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                   &_segNum->matrix)->trace->trace_del_table + 0x10) +
                  (long)s1Len * 4) = (int)vHS[0]._6_2_;
          *(int *)(*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                   &_segNum->matrix)->trace->trace_del_table + 0x18) +
                  (long)s1Len * 4) = (int)vHL[0]._6_2_;
          pvE = pvHLLoad;
          pvHLLoad = palVar9;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar8;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar7;
          pvHMStore = pvHLoad;
          pvHLoad = palVar6;
        }
        for (k = 0; k < iVar52; k = k + 1) {
          t = k * 0x10;
          alVar99[0] = (ulong)(uint)k;
          alVar99[1]._0_4_ = iVar52;
          alVar99[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x20),alVar99,t,
                        seglen);
          vH_00[0] = (ulong)(uint)k;
          vH_00[1]._0_4_ = iVar52;
          vH_00[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x28),vH_00,t,
                        seglen);
          vH_01[0] = (ulong)(uint)k;
          vH_01[1]._0_4_ = iVar52;
          vH_01[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x30),vH_01,t,
                        seglen);
          vH_02[0] = (ulong)(uint)k;
          vH_02[1]._0_4_ = iVar52;
          vH_02[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x38),vH_02,t,
                        seglen);
        }
        vH_2[0] = pvHLoad[iVar58][1];
        vHM_2[0] = pvHMLoad[iVar58][1];
        vHS_2[0] = pvHSLoad[iVar58][1];
        vHL_2[0] = pvHLLoad[iVar58][1];
        uStack_10c8 = pvHLLoad[iVar58][0];
        vHL_2[1] = pvHSLoad[iVar58][0];
        vHS_2[1] = pvHMLoad[iVar58][0];
        vHM_2[1] = pvHLoad[iVar58][0];
        for (end_query = 0; end_query < iVar53; end_query = end_query + 1) {
          vH_2[0] = vH_2[0] << 0x10 | (ulong)vHM_2[1] >> 0x30;
          vHM_2[0] = vHM_2[0] << 0x10 | (ulong)vHS_2[1] >> 0x30;
          vHS_2[0] = vHS_2[0] << 0x10 | (ulong)vHL_2[1] >> 0x30;
          vHL_2[0] = vHL_2[0] << 0x10 | uStack_10c8 >> 0x30;
          uStack_10c8 = uStack_10c8 << 0x10;
          vHL_2[1] = vHL_2[1] << 0x10;
          vHS_2[1] = vHS_2[1] << 0x10;
          vHM_2[1] = vHM_2[1] << 0x10;
        }
        local_e0a = vH_2[0]._6_2_;
        local_e0c = vHM_2[0]._6_2_;
        local_e0e = vHS_2[0]._6_2_;
        local_e10 = vHL_2[0]._6_2_;
        local_c8 = (short)vSaturationCheckMax[1];
        sStack_c6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_c4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_c2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_c0 = (short)vSaturationCheckMin[0];
        sStack_be = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_bc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_ba = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_1f8 = (short)result;
        sStack_1f6 = (short)((ulong)result >> 0x10);
        sStack_1f4 = (short)((ulong)result >> 0x20);
        sStack_1f2 = (short)((ulong)result >> 0x30);
        sStack_1f0 = (short)vSaturationCheckMax[0];
        sStack_1ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_1ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_1ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar62 = CONCAT26(-(ushort)(sStack_ba < sVar50),
                          CONCAT24(-(ushort)(sStack_bc < sVar50),
                                   CONCAT22(-(ushort)(sStack_be < sVar50),
                                            -(ushort)(sStack_c0 < sVar50)))) |
                 CONCAT26(-(ushort)(sVar51 < sStack_1ea),
                          CONCAT24(-(ushort)(sVar51 < sStack_1ec),
                                   CONCAT22(-(ushort)(sVar51 < sStack_1ee),
                                            -(ushort)(sVar51 < sStack_1f0))));
        auVar48._8_8_ = uVar62;
        auVar48._0_8_ =
             CONCAT26(-(ushort)(sStack_c2 < sVar50),
                      CONCAT24(-(ushort)(sStack_c4 < sVar50),
                               CONCAT22(-(ushort)(sStack_c6 < sVar50),-(ushort)(local_c8 < sVar50)))
                     ) |
             CONCAT26(-(ushort)(sVar51 < sStack_1f2),
                      CONCAT24(-(ushort)(sVar51 < sStack_1f4),
                               CONCAT22(-(ushort)(sVar51 < sStack_1f6),-(ushort)(sVar51 < local_1f8)
                                       )));
        if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar48 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar48 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar48 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar48 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar48 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar62 >> 7 & 1) != 0) || (uVar62 >> 0xf & 1) != 0) || (uVar62 >> 0x17 & 1) != 0)
               || (uVar62 >> 0x1f & 1) != 0) || (uVar62 >> 0x27 & 1) != 0) ||
             (uVar62 >> 0x2f & 1) != 0) || (uVar62 >> 0x37 & 1) != 0) || (long)uVar62 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_e0a = 0;
          local_e0c = 0;
          local_e0e = 0;
          local_e10 = 0;
          local_d10 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_e0a;
        *(int *)((long)&_segNum->s1 + 4) = local_d10;
        _segNum->s1Len = matrix._4_4_;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->extra =
             (int)local_e0c;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             (int)local_e0e;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)local_e10;
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}